

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interfaces_tests.cpp
# Opt level: O3

void __thiscall interfaces_tests::findAncestorByHash::test_method(findAncestorByHash *this)

{
  pointer ppCVar1;
  uint256 *puVar2;
  Chain *pCVar3;
  base_blob<256U> *pbVar4;
  int iVar5;
  unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *puVar6;
  Chainstate *pCVar7;
  char *pcVar8;
  iterator pvVar9;
  iterator in_R9;
  iterator pvVar10;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  check_type cVar11;
  char *local_1b8;
  char *local_1b0;
  undefined1 *local_1a8;
  undefined1 *local_1a0;
  char *local_198;
  char *local_190;
  undefined4 local_184;
  undefined1 *local_180;
  undefined1 *local_178;
  char *local_170;
  char *local_168;
  char *local_160;
  char *local_158;
  int *local_150;
  char *local_148;
  assertion_result local_140;
  int **local_128;
  assertion_result local_120;
  undefined1 *local_108;
  undefined1 *local_100;
  char *local_f8;
  char *local_f0;
  int height;
  undefined4 *local_e0;
  undefined **local_d8;
  int *piStack_d0;
  undefined1 *local_c8;
  int **ppiStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined1 uStack_a0;
  undefined7 uStack_9f;
  undefined1 local_98;
  undefined7 uStack_97;
  undefined1 uStack_90;
  undefined7 uStack_8f;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock17;
  lazy_ostream local_78;
  undefined1 *local_68;
  char *pcStack_60;
  undefined **local_58;
  ulong uStack_50;
  undefined1 *local_48;
  undefined4 **ppuStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  puVar6 = &(this->super_BOOST_AUTO_TEST_CASE_FIXTURE).super_TestingSetup.super_ChainTestingSetup.
            super_BasicTestingSetup.m_node.chainman;
  inline_assertion_check<true,std::unique_ptr<ChainstateManager,std::default_delete<ChainstateManager>>&>
            (puVar6,
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/interfaces_tests.cpp"
             ,0x59,"test_method","m_node.chainman");
  criticalblock17.super_unique_lock._M_device = &cs_main.super_recursive_mutex;
  criticalblock17.super_unique_lock._M_owns = false;
  std::unique_lock<std::recursive_mutex>::lock(&criticalblock17.super_unique_lock);
  pcVar8 = "m_node.chainman";
  puVar6 = inline_assertion_check<true,std::unique_ptr<ChainstateManager,std::default_delete<ChainstateManager>>&>
                     (puVar6,
                      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/interfaces_tests.cpp"
                      ,0x5b,"test_method","m_node.chainman");
  pCVar7 = ChainstateManager::ActiveChainstate
                     ((puVar6->_M_t).
                      super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                      .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
  height = -1;
  local_f8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/interfaces_tests.cpp"
  ;
  local_f0 = "";
  local_108 = &boost::unit_test::basic_cstring<char_const>::null;
  local_100 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x5d;
  file.m_begin = (iterator)&local_f8;
  msg.m_end = in_R9;
  msg.m_begin = pcVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_108,msg);
  ppCVar1 = (pCVar7->m_chain).vChain.
            super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  puVar2 = ppCVar1[0x14]->phashBlock;
  if (puVar2 != (uint256 *)0x0) {
    pCVar3 = (this->super_BOOST_AUTO_TEST_CASE_FIXTURE).super_TestingSetup.super_ChainTestingSetup.
             super_BasicTestingSetup.m_node.chain._M_t.
             super___uniq_ptr_impl<interfaces::Chain,_std::default_delete<interfaces::Chain>_>._M_t.
             super__Tuple_impl<0UL,_interfaces::Chain_*,_std::default_delete<interfaces::Chain>_>.
             super__Head_base<0UL,_interfaces::Chain_*,_false>._M_head_impl;
    local_58 = *(undefined ***)&puVar2->super_base_blob<256U>;
    uStack_50 = *(ulong *)((puVar2->super_base_blob<256U>).m_data._M_elems + 8);
    local_48 = *(undefined1 **)((puVar2->super_base_blob<256U>).m_data._M_elems + 0x10);
    ppuStack_40 = *(undefined4 ***)((puVar2->super_base_blob<256U>).m_data._M_elems + 0x18);
    puVar2 = ppCVar1[10]->phashBlock;
    if (puVar2 != (uint256 *)0x0) {
      local_78._vptr_lazy_ostream = *(_func_int ***)&puVar2->super_base_blob<256U>;
      local_78._8_8_ = *(undefined8 *)((puVar2->super_base_blob<256U>).m_data._M_elems + 8);
      local_68 = *(undefined1 **)((puVar2->super_base_blob<256U>).m_data._M_elems + 0x10);
      pcStack_60 = *(char **)((puVar2->super_base_blob<256U>).m_data._M_elems + 0x18);
      local_d8 = (undefined **)0x0;
      local_98 = 0;
      uStack_97 = 0;
      uStack_90 = 0;
      uStack_8f = 0;
      local_a8 = 0;
      uStack_a0 = 0;
      uStack_9f = 0;
      local_b8 = 0;
      uStack_b0 = 0;
      local_c8 = (undefined1 *)0x0;
      ppiStack_c0 = (int **)0x0;
      piStack_d0 = &height;
      _cVar11 = 0x3fa6f9;
      iVar5 = (*pCVar3->_vptr_Chain[0xd])(pCVar3,&local_58,&local_78,&local_d8);
      local_120.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
           (readonly_property<bool>)(class_property<bool>)SUB41(iVar5,0);
      local_120.m_message.px = (element_type *)0x0;
      local_120.m_message.pn.pi_ = (sp_counted_base *)0x0;
      local_150 = (int *)0xe9f5ec;
      local_148 = "";
      local_140.m_message.px = (element_type *)((ulong)local_140.m_message.px & 0xffffffffffffff00);
      local_140._0_8_ = &PTR__lazy_ostream_013ae1c8;
      local_140.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
      local_160 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/interfaces_tests.cpp"
      ;
      local_158 = "";
      pvVar9 = (iterator)0x1;
      pvVar10 = (iterator)0x0;
      local_128 = &local_150;
      boost::test_tools::tt_detail::report_assertion
                (&local_120,(lazy_ostream *)&local_140,1,0,WARN,_cVar11,(size_t)&local_160,0x5d);
      boost::detail::shared_count::~shared_count(&local_120.m_message.pn);
      local_170 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/interfaces_tests.cpp"
      ;
      local_168 = "";
      local_180 = &boost::unit_test::basic_cstring<char_const>::null;
      local_178 = &boost::unit_test::basic_cstring<char_const>::null;
      file_00.m_end = (iterator)0x5e;
      file_00.m_begin = (iterator)&local_170;
      msg_00.m_end = pvVar10;
      msg_00.m_begin = pvVar9;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_180,
                 msg_00);
      local_78._8_8_ = local_78._8_8_ & 0xffffffffffffff00;
      local_78._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae088;
      local_68 = boost::unit_test::lazy_ostream::inst;
      pcStack_60 = "";
      local_e0 = &local_184;
      local_184 = 10;
      local_140.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
           (readonly_property<bool>)(readonly_property<bool>)(height == 10);
      local_140.m_message.px = (element_type *)0x0;
      local_140.m_message.pn.pi_ = (sp_counted_base *)0x0;
      local_120._0_8_ =
           "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/interfaces_tests.cpp"
      ;
      local_120.m_message.px = (element_type *)0xe9f039;
      local_150 = &height;
      piStack_d0 = (int *)((ulong)piStack_d0 & 0xffffffffffffff00);
      local_d8 = &PTR__lazy_ostream_013ae248;
      local_c8 = boost::unit_test::lazy_ostream::inst;
      ppuStack_40 = &local_e0;
      uStack_50 = uStack_50 & 0xffffffffffffff00;
      local_58 = &PTR__lazy_ostream_013ae248;
      local_48 = boost::unit_test::lazy_ostream::inst;
      pvVar9 = (iterator)0x1;
      pvVar10 = (iterator)0x2;
      ppiStack_c0 = &local_150;
      boost::test_tools::tt_detail::report_assertion
                (&local_140,&local_78,1,2,REQUIRE,0xfcb3f0,(size_t)&local_120,0x5e,&local_d8,"10",
                 &local_58);
      boost::detail::shared_count::~shared_count(&local_140.m_message.pn);
      local_198 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/interfaces_tests.cpp"
      ;
      local_190 = "";
      local_1a8 = &boost::unit_test::basic_cstring<char_const>::null;
      local_1a0 = &boost::unit_test::basic_cstring<char_const>::null;
      file_01.m_end = (iterator)0x5f;
      file_01.m_begin = (iterator)&local_198;
      msg_01.m_end = pvVar10;
      msg_01.m_begin = pvVar9;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_1a8,
                 msg_01);
      ppCVar1 = (pCVar7->m_chain).vChain.
                super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      puVar2 = ppCVar1[10]->phashBlock;
      if (puVar2 != (uint256 *)0x0) {
        pCVar3 = (this->super_BOOST_AUTO_TEST_CASE_FIXTURE).super_TestingSetup.
                 super_ChainTestingSetup.super_BasicTestingSetup.m_node.chain._M_t.
                 super___uniq_ptr_impl<interfaces::Chain,_std::default_delete<interfaces::Chain>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_interfaces::Chain_*,_std::default_delete<interfaces::Chain>_>
                 .super__Head_base<0UL,_interfaces::Chain_*,_false>._M_head_impl;
        local_58 = *(undefined ***)&puVar2->super_base_blob<256U>;
        uStack_50 = *(ulong *)((puVar2->super_base_blob<256U>).m_data._M_elems + 8);
        local_48 = *(undefined1 **)((puVar2->super_base_blob<256U>).m_data._M_elems + 0x10);
        ppuStack_40 = *(undefined4 ***)((puVar2->super_base_blob<256U>).m_data._M_elems + 0x18);
        puVar2 = ppCVar1[0x14]->phashBlock;
        if (puVar2 != (uint256 *)0x0) {
          local_78._vptr_lazy_ostream = *(_func_int ***)&puVar2->super_base_blob<256U>;
          pbVar4 = &puVar2->super_base_blob<256U>;
          local_78.m_empty = (bool)(pbVar4->m_data)._M_elems[8];
          local_78._9_1_ = (pbVar4->m_data)._M_elems[9];
          local_78._10_1_ = (pbVar4->m_data)._M_elems[10];
          local_78._11_1_ = (pbVar4->m_data)._M_elems[0xb];
          local_78._12_1_ = (pbVar4->m_data)._M_elems[0xc];
          local_78._13_1_ = (pbVar4->m_data)._M_elems[0xd];
          local_78._14_1_ = (pbVar4->m_data)._M_elems[0xe];
          local_78._15_1_ = (pbVar4->m_data)._M_elems[0xf];
          local_68 = *(undefined1 **)((puVar2->super_base_blob<256U>).m_data._M_elems + 0x10);
          pcStack_60 = *(char **)((puVar2->super_base_blob<256U>).m_data._M_elems + 0x18);
          local_98 = 0;
          uStack_97 = 0;
          uStack_90 = 0;
          local_a8 = 0;
          uStack_a0 = 0;
          uStack_9f = 0;
          local_b8 = 0;
          uStack_b0 = 0;
          local_c8 = (undefined1 *)0x0;
          ppiStack_c0 = (int **)0x0;
          local_d8 = (undefined **)0x0;
          piStack_d0 = (int *)0x0;
          _cVar11 = 0x3fa97b;
          iVar5 = (*pCVar3->_vptr_Chain[0xd])(pCVar3,&local_58);
          local_120._0_8_ = CONCAT71(local_120._1_7_,(char)iVar5) ^ 1;
          local_120.m_message.px = (element_type *)0x0;
          local_120.m_message.pn.pi_ = (sp_counted_base *)0x0;
          local_150 = (int *)0xe9f65b;
          local_148 = "";
          local_140.m_message.px =
               (element_type *)((ulong)local_140.m_message.px & 0xffffffffffffff00);
          local_140._0_8_ = &PTR__lazy_ostream_013ae1c8;
          local_140.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
          local_1b8 = 
          "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/interfaces_tests.cpp"
          ;
          local_1b0 = "";
          local_128 = &local_150;
          boost::test_tools::tt_detail::report_assertion
                    (&local_120,(lazy_ostream *)&local_140,1,0,WARN,_cVar11,(size_t)&local_1b8,0x5f)
          ;
          boost::detail::shared_count::~shared_count(&local_120.m_message.pn);
          std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock17.super_unique_lock);
          if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
            __stack_chk_fail();
          }
          return;
        }
      }
    }
  }
  __assert_fail("phashBlock != nullptr",
                "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/chain.h",
                0xf5,"uint256 CBlockIndex::GetBlockHash() const");
}

Assistant:

BOOST_AUTO_TEST_CASE(findAncestorByHash)
{
    LOCK(Assert(m_node.chainman)->GetMutex());
    auto& chain = m_node.chain;
    const CChain& active = Assert(m_node.chainman)->ActiveChain();
    int height = -1;
    BOOST_CHECK(chain->findAncestorByHash(active[20]->GetBlockHash(), active[10]->GetBlockHash(), FoundBlock().height(height)));
    BOOST_CHECK_EQUAL(height, 10);
    BOOST_CHECK(!chain->findAncestorByHash(active[10]->GetBlockHash(), active[20]->GetBlockHash()));
}